

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_validate.c
# Opt level: O2

int cfg_validate_printable(autobuf *out,char *section_name,char *entry_name,char *value,size_t len)

{
  _Bool _Var1;
  int iVar2;
  
  iVar2 = cfg_validate_strlen(out,section_name,entry_name,value,len);
  if (iVar2 == 0) {
    _Var1 = str_is_printable(value);
    if (_Var1) {
      return 0;
    }
    cfg_append_printable_line
              (out,"Value \'%s\' for entry \'%s\' in section %s has non-printable characters",value,
               entry_name,section_name);
  }
  return -1;
}

Assistant:

int
cfg_validate_printable(
  struct autobuf *out, const char *section_name, const char *entry_name, const char *value, size_t len) {
  if (cfg_validate_strlen(out, section_name, entry_name, value, len)) {
    return -1;
  }
  if (!str_is_printable(value)) {
    /* not a printable ascii character */
    cfg_append_printable_line(out,
      "Value '%s' for entry '%s'"
      " in section %s has non-printable characters",
      value, entry_name, section_name);
    return -1;
  }
  return 0;
}